

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *parentpos,ChVector<double> *parentspeed,ChVector<double> *parentacc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ChVector<double> localspeed;
  ChVector<double> localpos;
  ChVector<double> local_60;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  ChTransform<double>::TransformParentToLocal
            (parentpos,&(this->super_ChFrame<double>).coord.pos,
             &(this->super_ChFrame<double>).Amatrix);
  PointSpeedParentToLocal(&local_60,this,parentpos,parentspeed);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_48;
  dVar1 = (this->coord_dtdt).rot.m_data[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  dVar2 = (this->coord_dtdt).rot.m_data[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_40;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_38;
  auVar20 = ZEXT816(0) << 0x40;
  dVar3 = (this->coord_dtdt).rot.m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->coord_dtdt).rot.m_data[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1 * 0.0;
  auVar9 = vfmadd231sd_fma(auVar36,auVar6,auVar24);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 * 0.0;
  auVar10 = vfmadd231sd_fma(auVar38,auVar22,auVar6);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar3 * 0.0;
  auVar17 = vfmadd231sd_fma(auVar34,auVar6,auVar25);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_48 * dVar3;
  auVar6 = vfmsub231sd_fma(auVar32,auVar6,auVar20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar25);
  auVar10 = vfnmadd231sd_fma(auVar10,auVar25,auVar12);
  auVar17 = vfnmadd231sd_fma(auVar17,auVar14,auVar24);
  auVar6 = vfnmadd231sd_fma(auVar6,auVar12,auVar24);
  auVar7 = vfnmadd231sd_fma(auVar9,auVar5,auVar22);
  auVar9 = vfmadd231sd_fma(auVar10,auVar24,auVar5);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar10 = vfmadd231sd_fma(auVar17,auVar12,auVar22);
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar6 = vfnmadd231sd_fma(auVar6,auVar14,auVar22);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar5 = vmulsd_avx512f(auVar15,auVar7);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar10._0_8_ * dVar1;
  auVar17 = vfnmadd231sd_fma(auVar40,auVar6,auVar18);
  auVar5 = vfnmadd231sd_avx512f(auVar5,auVar6,auVar16);
  auVar17 = vfmadd231sd_fma(auVar17,auVar9,auVar16);
  auVar5 = vfnmadd231sd_avx512f(auVar5,auVar9,auVar18);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar9._0_8_ * dVar1;
  auVar9 = vfnmadd231sd_fma(auVar39,auVar19,auVar6);
  auVar17 = vfnmadd231sd_fma(auVar17,auVar7,auVar19);
  auVar6 = vfmadd231sd_avx512f(auVar5,auVar10,auVar19);
  auVar9 = vfmadd231sd_fma(auVar9,auVar18,auVar7);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (this->coord_dt).rot.m_data[3];
  auVar7 = vaddsd_avx512f(auVar6,auVar6);
  auVar6 = vfnmadd231sd_fma(auVar9,auVar16,auVar10);
  dVar2 = (this->coord_dt).rot.m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  dVar3 = (this->coord_dt).rot.m_data[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = parentacc->m_data[1] - (this->coord_dtdt).pos.m_data[1];
  auVar5 = vsubsd_avx512f(auVar27,auVar7);
  dVar4 = (this->coord_dt).rot.m_data[1];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4;
  auVar8 = vmulsd_avx512f(auVar37,auVar20);
  auVar9 = vmulsd_avx512f(auVar25,auVar30);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * 0.0;
  auVar10 = vfmadd213sd_avx512f(auVar24,auVar33,auVar29);
  auVar9 = vfmsub231sd_avx512f(auVar9,auVar33,auVar20);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar4 * 0.0;
  auVar7 = vfmadd213sd_avx512f(auVar25,auVar33,auVar28);
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar37,auVar25);
  auVar9 = vfnmadd231sd_avx512f(auVar9,auVar35,auVar24);
  auVar7 = vfnmadd231sd_avx512f(auVar7,auVar37,auVar24);
  auVar11 = vfnmadd231sd_avx512f(auVar10,auVar30,auVar22);
  auVar12 = vfnmadd231sd_avx512f(auVar9,auVar37,auVar22);
  auVar13 = vfmadd231sd_avx512f(auVar7,auVar35,auVar22);
  auVar9 = vfmadd213sd_avx512f(auVar22,auVar33,auVar8);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar35,auVar25);
  auVar10 = vmulsd_avx512f(auVar33,auVar11);
  auVar10 = vfnmadd231sd_avx512f(auVar10,auVar12,auVar35);
  auVar9 = vfmadd231sd_fma(auVar9,auVar30,auVar24);
  auVar7 = vmulsd_avx512f(auVar33,auVar13);
  auVar14 = vfnmadd231sd_avx512f(auVar7,auVar12,auVar30);
  auVar7 = vfnmadd231sd_fma(auVar10,auVar9,auVar30);
  auVar10 = vfmadd231sd_fma(auVar14,auVar9,auVar35);
  auVar7 = vfmadd231sd_avx512f(auVar7,auVar13,auVar37);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3 * auVar9._0_8_;
  auVar9 = vfnmadd231sd_avx512f(auVar23,auVar37,auVar12);
  auVar12 = vfnmadd231sd_avx512f(auVar10,auVar11,auVar37);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar30,auVar11);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar7._0_8_ + auVar7._0_8_;
  auVar5 = vsubsd_avx512f(auVar5,auVar26);
  auVar11 = vfnmadd231sd_avx512f(auVar9,auVar35,auVar13);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_60.m_data[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_60.m_data[0];
  auVar10 = vmulsd_avx512f(auVar44,auVar30);
  auVar7 = vfmadd231sd_avx512f(auVar28,auVar33,auVar44);
  auVar9 = vfmadd231sd_fma(auVar29,auVar33,auVar41);
  auVar13 = vfmsub231sd_avx512f(auVar10,auVar33,auVar20);
  auVar10 = vfnmadd231sd_fma(auVar7,auVar37,auVar41);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_60.m_data[0];
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar45,auVar37);
  auVar7 = vfnmadd231sd_avx512f(auVar13,auVar35,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_60.m_data[2];
  auVar13 = vfmadd231sd_avx512f(auVar10,auVar35,auVar42);
  auVar9 = vfnmadd231sd_avx512f(auVar9,auVar30,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_60.m_data[2];
  auVar10 = vfnmadd231sd_avx512f(auVar7,auVar37,auVar43);
  auVar7 = vfmadd213sd_avx512f(auVar43,auVar33,auVar8);
  auVar7 = vfnmadd231sd_avx512f(auVar7,auVar35,auVar45);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar13._0_8_ * dVar1;
  auVar8 = vfnmadd231sd_avx512f(auVar21,auVar10,auVar18);
  auVar7 = vfmadd231sd_avx512f(auVar7,auVar30,auVar41);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar9._0_8_ * dVar1;
  auVar14 = vfnmadd231sd_avx512f(auVar31,auVar10,auVar16);
  auVar15 = vmulsd_avx512f(auVar15,auVar7);
  auVar8 = vfmadd231sd_avx512f(auVar8,auVar7,auVar16);
  auVar10 = vfnmadd231sd_avx512f(auVar15,auVar19,auVar10);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar7,auVar18);
  auVar7 = vfnmadd231sd_fma(auVar8,auVar9,auVar19);
  auVar9 = vfmadd231sd_fma(auVar10,auVar18,auVar9);
  auVar10 = vfmadd231sd_fma(auVar14,auVar13,auVar19);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar16,auVar13);
  dVar1 = auVar5._0_8_ - auVar10._0_8_ * 4.0;
  dVar2 = (((parentacc->m_data[0] - (this->coord_dtdt).pos.m_data[0]) -
           (auVar17._0_8_ + auVar17._0_8_)) - (auVar12._0_8_ + auVar12._0_8_)) - auVar7._0_8_ * 4.0;
  dVar3 = (((parentacc->m_data[2] - (this->coord_dtdt).pos.m_data[2]) -
           (auVar6._0_8_ + auVar6._0_8_)) - (auVar11._0_8_ + auVar11._0_8_)) - auVar9._0_8_ * 4.0;
  auVar13._0_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x18);
  auVar13._8_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       dVar1 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x28);
  auVar17 = vfmadd231sd_fma(auVar20,auVar8,auVar9);
  auVar11._8_8_ = dVar2;
  auVar11._0_8_ = dVar2;
  auVar9 = vfmadd132pd_fma(auVar11,auVar13,
                           *(undefined1 (*) [16])
                            (this->super_ChFrame<double>).Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar3;
  auVar10 = vfmadd231sd_fma(auVar17,auVar7,auVar10);
  auVar17._8_8_ = dVar3;
  auVar17._0_8_ = dVar3;
  auVar9 = vfmadd132pd_fma(auVar17,auVar9,
                           *(undefined1 (*) [16])
                            ((long)(this->super_ChFrame<double>).Amatrix.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x30));
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar9;
  __return_storage_ptr__->m_data[2] = auVar10._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointAccelerationParentToLocal(const ChVector<Real>& parentpos,
                                                  const ChVector<Real>& parentspeed,
                                                  const ChVector<Real>& parentacc) const {
        ChVector<Real> localpos = ChFrame<Real>::TransformParentToLocal(parentpos);
        ChVector<Real> localspeed = PointSpeedParentToLocal(parentpos, parentspeed);
        return this->Amatrix.transpose() *
               (parentacc - coord_dtdt.pos -
                (coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2 -
                (coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2 -
                (coord_dt.rot % ChQuaternion<Real>(0, localspeed) % this->coord.rot.GetConjugate()).GetVector() * 4);
    }